

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxwell.cpp
# Opt level: O2

void __thiscall five_point_solver::advance_e(five_point_solver *this)

{
  cellb **ppcVar1;
  cellb **ppcVar2;
  cellj **ppcVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined8 uVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  field3d<celle> *pfVar20;
  field3d<cellb> *pfVar21;
  field3d<cellj> *pfVar22;
  celle *pcVar23;
  cellb ***pppcVar24;
  cellb **ppcVar25;
  cellb *pcVar26;
  cellb *pcVar27;
  cellb *pcVar28;
  cellb *pcVar29;
  cellb *pcVar30;
  cellb *pcVar31;
  cellb *pcVar32;
  cellj *pcVar33;
  cellb **ppcVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  int i_2;
  int i;
  long lVar38;
  int j;
  long lVar39;
  long lVar40;
  long lVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  
  pfVar20 = (this->super_maxwell_solver).ce;
  lVar35 = (long)pfVar20->nx + -2;
  lVar36 = (long)pfVar20->ny + -2;
  lVar37 = (long)pfVar20->nz + -2;
  for (lVar38 = 2; lVar38 < lVar35; lVar38 = lVar38 + 1) {
    for (lVar39 = 2; lVar39 < lVar36; lVar39 = lVar39 + 1) {
      lVar41 = 2;
      lVar40 = 0;
      dVar4 = (this->super_maxwell_solver).dtdz;
      auVar61._8_8_ = 0;
      auVar61._0_8_ = dVar4;
      dVar5 = (this->super_maxwell_solver).dtdx;
      auVar48._8_8_ = 0;
      auVar48._0_8_ = dVar5;
      dVar6 = (this->super_maxwell_solver).dtdy;
      auVar75._8_8_ = 0;
      auVar75._0_8_ = dVar6;
      auVar11._0_8_ = this->bx;
      auVar11._8_8_ = this->by;
      dVar9 = this->ax;
      dVar10 = this->ay;
      auVar12._0_8_ = (this->super_maxwell_solver).dx;
      auVar12._8_8_ = (this->super_maxwell_solver).dy;
      auVar59._8_8_ = 0;
      auVar59._0_8_ = (this->super_maxwell_solver).dz;
      auVar68._8_8_ = this->az;
      auVar68._0_8_ = this->az;
      auVar80._8_8_ = 0;
      auVar80._0_8_ = this->ay;
      pfVar21 = (this->super_maxwell_solver).cb;
      pfVar22 = (this->super_maxwell_solver).cj;
      auVar64._0_8_ = -dVar4;
      auVar64._8_8_ = 0x8000000000000000;
      auVar72._0_8_ = -dVar5;
      auVar72._8_8_ = 0x8000000000000000;
      auVar57._0_8_ = -dVar6;
      auVar57._8_8_ = 0x8000000000000000;
      auVar51 = vunpcklpd_avx(auVar61,auVar64);
      auVar53 = vunpcklpd_avx(auVar72,auVar75);
      auVar65._8_8_ = this->bz;
      auVar65._0_8_ = this->bz;
      auVar76._8_8_ = 0;
      auVar76._0_8_ = this->by;
      while (lVar41 < lVar37) {
        lVar41 = lVar41 + 1;
        pcVar23 = (pfVar20->p)._M_t.
                  super___uniq_ptr_impl<celle_**,_std::default_delete<celle_**[]>_>._M_t.
                  super__Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>.
                  super__Head_base<0UL,_celle_***,_false>._M_head_impl[lVar38][lVar39];
        pppcVar24 = (pfVar21->p)._M_t.
                    super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
                    super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                    super__Head_base<0UL,_cellb_***,_false>._M_head_impl;
        ppcVar25 = pppcVar24[lVar38];
        pcVar26 = ppcVar25[lVar39];
        pcVar27 = ppcVar25[lVar39 + -2];
        pcVar28 = ppcVar25[lVar39 + -1];
        pcVar29 = ppcVar25[lVar39 + 1];
        pcVar30 = pppcVar24[lVar38 + -2][lVar39];
        pcVar31 = pppcVar24[lVar38 + -1][lVar39];
        pcVar32 = pppcVar24[lVar38 + 1][lVar39];
        uVar7 = *(undefined8 *)((long)&pcVar26[2].bz + lVar40);
        auVar81._8_8_ = uVar7;
        auVar81._0_8_ = uVar7;
        uVar8 = *(ulong *)((long)&pcVar26[2].by + lVar40);
        auVar86._8_8_ = 0;
        auVar86._0_8_ = *(ulong *)((long)&pcVar31[2].bz + lVar40);
        auVar46 = vmovhpd_avx(auVar86,*(undefined8 *)((long)&pcVar28[2].bz + lVar40));
        uVar7 = *(undefined8 *)((long)&pcVar29[2].bz + lVar40);
        auVar91._8_8_ = uVar7;
        auVar91._0_8_ = uVar7;
        auVar45 = vsubpd_avx(auVar81,auVar46);
        auVar42 = vsubpd_avx512vl(auVar91,auVar81);
        auVar47 = *(undefined1 (*) [16])((long)&pcVar26[2].bx + lVar40);
        auVar82._0_8_ = auVar46._0_8_ + auVar42._0_8_;
        auVar82._8_8_ = auVar46._8_8_ + auVar42._8_8_;
        auVar87._8_8_ = 0;
        auVar87._0_8_ = *(ulong *)((long)&pcVar30[2].bz + lVar40);
        auVar46 = vmovhpd_avx(auVar87,*(undefined8 *)((long)&pcVar27[2].bz + lVar40));
        auVar43 = vsubpd_avx512vl(*(undefined1 (*) [16])((long)&pcVar26[3].bx + lVar40),auVar47);
        auVar42 = vsubpd_avx(auVar82,auVar46);
        auVar46 = *(undefined1 (*) [16])((long)&pcVar26[1].bx + lVar40);
        auVar83._0_8_ = auVar42._0_8_ * dVar9;
        auVar83._8_8_ = auVar42._8_8_ * dVar10;
        auVar42 = vfmadd231pd_fma(auVar83,auVar11,auVar45);
        auVar45 = vpermilpd_avx(*(undefined1 (*) [16])((long)&pcVar23[2].ex + lVar40),1);
        auVar43 = vaddpd_avx512vl(auVar46,auVar43);
        auVar43 = vsubpd_avx512vl(auVar43,*(undefined1 (*) [16])((long)&pcVar26->bx + lVar40));
        auVar44 = vsubpd_avx512vl(auVar47,auVar46);
        auVar46 = vfmadd213pd_fma(auVar42,auVar53,auVar45);
        auVar45 = vmulpd_avx512vl(auVar68,auVar43);
        pcVar33 = (pfVar22->p)._M_t.
                  super___uniq_ptr_impl<cellj_**,_std::default_delete<cellj_**[]>_>._M_t.
                  super__Tuple_impl<0UL,_cellj_***,_std::default_delete<cellj_**[]>_>.
                  super__Head_base<0UL,_cellj_***,_false>._M_head_impl[lVar38][lVar39];
        auVar45 = vfmadd231pd_fma(auVar45,auVar65,auVar44);
        auVar46 = vfmadd213pd_fma(auVar45,auVar51,auVar46);
        auVar46 = vshufpd_avx(auVar46,auVar46,1);
        auVar46 = vfnmadd231pd_fma(auVar46,auVar12,
                                   *(undefined1 (*) [16])((long)&pcVar33[2].jx + lVar40));
        *(undefined1 (*) [16])((long)&pcVar23[2].ex + lVar40) = auVar46;
        auVar88._8_8_ = 0;
        auVar88._0_8_ = *(ulong *)((long)&pcVar32[2].by + lVar40);
        dVar4 = *(double *)((long)&pcVar31[2].by + lVar40);
        auVar84._8_8_ = 0;
        auVar84._0_8_ = dVar4;
        auVar90._8_8_ = 0;
        auVar90._0_8_ = *(ulong *)((long)&pcVar28[2].bx + lVar40);
        auVar93._8_8_ = 0;
        auVar93._0_8_ = uVar8;
        auVar46 = vsubsd_avx512f(auVar88,auVar93);
        auVar92._8_8_ = 0;
        auVar92._0_8_ = *(ulong *)((long)&pcVar29[2].bx + lVar40);
        auVar45 = vsubsd_avx512f(auVar92,auVar47);
        auVar45 = vaddsd_avx512f(auVar90,auVar45);
        auVar13._8_8_ = 0;
        auVar13._0_8_ = *(ulong *)((long)&pcVar27[2].bx + lVar40);
        auVar45 = vsubsd_avx512f(auVar45,auVar13);
        auVar42 = vsubsd_avx512f(auVar93,auVar84);
        auVar89._8_8_ = 0;
        auVar89._0_8_ =
             ((dVar4 + auVar46._0_8_) - *(double *)((long)&pcVar30[2].by + lVar40)) * dVar9;
        auVar46 = vfmadd231sd_fma(auVar89,auVar11,auVar42);
        auVar14._8_8_ = 0;
        auVar14._0_8_ = *(ulong *)((long)&pcVar23[2].ez + lVar40);
        auVar46 = vfmadd213sd_fma(auVar46,auVar48,auVar14);
        auVar47 = vsubsd_avx512f(auVar47,auVar90);
        auVar45 = vmulsd_avx512f(auVar80,auVar45);
        auVar47 = vfmadd231sd_fma(auVar45,auVar76,auVar47);
        auVar47 = vfmadd213sd_fma(auVar47,auVar57,auVar46);
        auVar15._8_8_ = 0;
        auVar15._0_8_ = *(ulong *)((long)&pcVar33[2].jz + lVar40);
        auVar47 = vfnmadd231sd_fma(auVar47,auVar59,auVar15);
        *(long *)((long)&pcVar23[2].ez + lVar40) = auVar47._0_8_;
        lVar40 = lVar40 + 0x18;
      }
    }
  }
  for (lVar38 = 2; lVar38 < lVar36; lVar38 = lVar38 + 1) {
    lVar40 = 0;
    lVar39 = 2;
    auVar49._8_8_ = 0;
    auVar49._0_8_ = (this->super_maxwell_solver).dtdy;
    auVar52._8_8_ = 0;
    auVar52._0_8_ = this->by;
    dVar4 = this->ay;
    auVar55._8_8_ = 0;
    auVar55._0_8_ = this->bz;
    dVar5 = this->az;
    auVar62._8_8_ = 0;
    auVar62._0_8_ = (this->super_maxwell_solver).dx;
    pfVar21 = (this->super_maxwell_solver).cb;
    pfVar22 = (this->super_maxwell_solver).cj;
    auVar60._0_8_ = -(this->super_maxwell_solver).dtdz;
    auVar60._8_8_ = 0x8000000000000000;
    while (lVar39 < lVar37) {
      lVar39 = lVar39 + 1;
      ppcVar25 = (pfVar21->p)._M_t.super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>
                 ._M_t.super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                 super__Head_base<0UL,_cellb_***,_false>._M_head_impl[1];
      pcVar26 = ppcVar25[lVar38];
      dVar6 = *(double *)((long)&pcVar26[2].bz + lVar40);
      dVar9 = *(double *)((long)&ppcVar25[lVar38 + -1][2].bz + lVar40);
      pcVar23 = (pfVar20->p)._M_t.super___uniq_ptr_impl<celle_**,_std::default_delete<celle_**[]>_>.
                _M_t.super__Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>.
                super__Head_base<0UL,_celle_***,_false>._M_head_impl[1][lVar38];
      dVar10 = *(double *)((long)&pcVar26[1].by + lVar40);
      auVar66._8_8_ = 0;
      auVar66._0_8_ =
           ((dVar9 + (*(double *)((long)&ppcVar25[lVar38 + 1][2].bz + lVar40) - dVar6)) -
           *(double *)((long)&ppcVar25[lVar38 + -2][2].bz + lVar40)) * dVar4;
      auVar73._8_8_ = 0;
      auVar73._0_8_ = dVar6 - dVar9;
      auVar51 = vfmadd231sd_fma(auVar66,auVar52,auVar73);
      dVar6 = *(double *)((long)&pcVar26[2].by + lVar40);
      auVar16._8_8_ = 0;
      auVar16._0_8_ = *(ulong *)((long)&pcVar23[2].ex + lVar40);
      auVar51 = vfmadd213sd_fma(auVar51,auVar49,auVar16);
      auVar69._8_8_ = 0;
      auVar69._0_8_ =
           ((dVar10 + (*(double *)((long)&pcVar26[3].by + lVar40) - dVar6)) -
           *(double *)((long)&pcVar26->by + lVar40)) * dVar5;
      auVar77._8_8_ = 0;
      auVar77._0_8_ = dVar6 - dVar10;
      auVar53 = vfmadd231sd_fma(auVar69,auVar55,auVar77);
      auVar51 = vfmadd213sd_fma(auVar53,auVar60,auVar51);
      auVar17._8_8_ = 0;
      auVar17._0_8_ =
           *(ulong *)((long)&(pfVar22->p)._M_t.
                             super___uniq_ptr_impl<cellj_**,_std::default_delete<cellj_**[]>_>._M_t.
                             super__Tuple_impl<0UL,_cellj_***,_std::default_delete<cellj_**[]>_>.
                             super__Head_base<0UL,_cellj_***,_false>._M_head_impl[1][lVar38][2].jx +
                     lVar40);
      auVar51 = vfnmadd231sd_fma(auVar51,auVar62,auVar17);
      *(long *)((long)&pcVar23[2].ex + lVar40) = auVar51._0_8_;
      lVar40 = lVar40 + 0x18;
    }
  }
  for (lVar38 = 2; lVar38 < lVar35; lVar38 = lVar38 + 1) {
    lVar40 = 0;
    lVar39 = 2;
    auVar50._8_8_ = 0;
    auVar50._0_8_ = this->bx;
    dVar4 = this->ax;
    auVar56._8_8_ = 0;
    auVar56._0_8_ = (this->super_maxwell_solver).dtdz;
    auVar58._8_8_ = 0;
    auVar58._0_8_ = this->bz;
    dVar5 = this->az;
    auVar63._8_8_ = 0;
    auVar63._0_8_ = (this->super_maxwell_solver).dy;
    pfVar21 = (this->super_maxwell_solver).cb;
    pfVar22 = (this->super_maxwell_solver).cj;
    auVar54._0_8_ = -(this->super_maxwell_solver).dtdx;
    auVar54._8_8_ = 0x8000000000000000;
    while (lVar39 < lVar37) {
      pppcVar24 = (pfVar21->p)._M_t.
                  super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
                  super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                  super__Head_base<0UL,_cellb_***,_false>._M_head_impl;
      lVar39 = lVar39 + 1;
      pcVar26 = pppcVar24[lVar38][1];
      dVar6 = *(double *)((long)&pcVar26[2].bz + lVar40);
      dVar9 = *(double *)((long)&pppcVar24[lVar38 + -1][1][2].bz + lVar40);
      pcVar23 = (pfVar20->p)._M_t.super___uniq_ptr_impl<celle_**,_std::default_delete<celle_**[]>_>.
                _M_t.super__Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>.
                super__Head_base<0UL,_celle_***,_false>._M_head_impl[lVar38][1];
      dVar10 = *(double *)((long)&pcVar26[1].bx + lVar40);
      auVar67._8_8_ = 0;
      auVar67._0_8_ =
           ((dVar9 + (*(double *)((long)&pppcVar24[lVar38 + 1][1][2].bz + lVar40) - dVar6)) -
           *(double *)((long)&pppcVar24[lVar38 + -2][1][2].bz + lVar40)) * dVar4;
      auVar74._8_8_ = 0;
      auVar74._0_8_ = dVar6 - dVar9;
      auVar51 = vfmadd231sd_fma(auVar67,auVar50,auVar74);
      dVar6 = *(double *)((long)&pcVar26[2].bx + lVar40);
      auVar18._8_8_ = 0;
      auVar18._0_8_ = *(ulong *)((long)&pcVar23[2].ey + lVar40);
      auVar51 = vfmadd213sd_fma(auVar51,auVar54,auVar18);
      auVar70._8_8_ = 0;
      auVar70._0_8_ =
           ((dVar10 + (*(double *)((long)&pcVar26[3].bx + lVar40) - dVar6)) -
           *(double *)((long)&pcVar26->bx + lVar40)) * dVar5;
      auVar78._8_8_ = 0;
      auVar78._0_8_ = dVar6 - dVar10;
      auVar53 = vfmadd231sd_fma(auVar70,auVar58,auVar78);
      auVar51 = vfmadd213sd_fma(auVar53,auVar56,auVar51);
      auVar19._8_8_ = 0;
      auVar19._0_8_ =
           *(ulong *)((long)&(pfVar22->p)._M_t.
                             super___uniq_ptr_impl<cellj_**,_std::default_delete<cellj_**[]>_>._M_t.
                             super__Tuple_impl<0UL,_cellj_***,_std::default_delete<cellj_**[]>_>.
                             super__Head_base<0UL,_cellj_***,_false>._M_head_impl[lVar38][1][2].jy +
                     lVar40);
      auVar51 = vfnmadd231sd_fma(auVar51,auVar63,auVar19);
      *(long *)((long)&pcVar23[2].ey + lVar40) = auVar51._0_8_;
      lVar40 = lVar40 + 0x18;
    }
  }
  for (lVar37 = 2; lVar37 < lVar35; lVar37 = lVar37 + 1) {
    lVar38 = 2;
    auVar51._8_8_ = 0;
    auVar51._0_8_ = (this->super_maxwell_solver).dtdx;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = this->bx;
    dVar4 = this->ax;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = this->by;
    dVar5 = this->ay;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = (this->super_maxwell_solver).dz;
    pfVar21 = (this->super_maxwell_solver).cb;
    pfVar22 = (this->super_maxwell_solver).cj;
    auVar46._0_8_ = -(this->super_maxwell_solver).dtdy;
    auVar46._8_8_ = 0x8000000000000000;
    while (lVar38 < lVar36) {
      pppcVar24 = (pfVar21->p)._M_t.
                  super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
                  super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                  super__Head_base<0UL,_cellb_***,_false>._M_head_impl;
      ppcVar34 = pppcVar24[lVar37];
      ppcVar25 = pppcVar24[lVar37 + -1] + lVar38;
      pcVar23 = (pfVar20->p)._M_t.super___uniq_ptr_impl<celle_**,_std::default_delete<celle_**[]>_>.
                _M_t.super__Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>.
                super__Head_base<0UL,_celle_***,_false>._M_head_impl[lVar37][lVar38];
      dVar6 = ppcVar34[lVar38][1].by;
      dVar9 = ppcVar34[lVar38][1].bx;
      lVar39 = lVar38 + -1;
      ppcVar1 = pppcVar24[lVar37 + 1] + lVar38;
      ppcVar2 = pppcVar24[lVar37 + -2] + lVar38;
      lVar40 = lVar38 + -2;
      lVar41 = lVar38 + 1;
      ppcVar3 = (pfVar22->p)._M_t.super___uniq_ptr_impl<cellj_**,_std::default_delete<cellj_**[]>_>.
                _M_t.super__Tuple_impl<0UL,_cellj_***,_std::default_delete<cellj_**[]>_>.
                super__Head_base<0UL,_cellj_***,_false>._M_head_impl[lVar37] + lVar38;
      lVar38 = lVar38 + 1;
      auVar71._8_8_ = 0;
      auVar71._0_8_ = (((*ppcVar25)[1].by + ((*ppcVar1)[1].by - dVar6)) - (*ppcVar2)[1].by) * dVar4;
      auVar79._8_8_ = 0;
      auVar79._0_8_ = dVar6 - (*ppcVar25)[1].by;
      auVar43 = vfmadd231sd_fma(auVar71,auVar53,auVar79);
      auVar42._8_8_ = 0;
      auVar42._0_8_ = pcVar23[1].ez;
      auVar42 = vfmadd213sd_fma(auVar43,auVar51,auVar42);
      auVar44._8_8_ = 0;
      auVar44._0_8_ =
           ((ppcVar34[lVar39][1].bx + (ppcVar34[lVar41][1].bx - dVar9)) - ppcVar34[lVar40][1].bx) *
           dVar5;
      auVar85._8_8_ = 0;
      auVar85._0_8_ = dVar9 - ppcVar34[lVar39][1].bx;
      auVar43 = vfmadd231sd_fma(auVar44,auVar47,auVar85);
      auVar42 = vfmadd213sd_fma(auVar43,auVar46,auVar42);
      auVar43._8_8_ = 0;
      auVar43._0_8_ = (*ppcVar3)[1].jz;
      auVar42 = vfnmadd231sd_fma(auVar42,auVar45,auVar43);
      pcVar23[1].ez = auVar42._0_8_;
    }
  }
  return;
}

Assistant:

void five_point_solver::advance_e()
{
    const int nx = ce.get_nx();
    const int ny = ce.get_ny();
    const int nz = ce.get_nz();

    for(int i=2;i<nx-2;i++) {
        for(int j=2;j<ny-2;j++) {
            for(int k=2;k<nz-2;k++) {
                ce[i][j][k].ex = ce[i][j][k].ex   +   dtdy*( by*(cb[i][j][k].bz-cb[i][j-1][k].bz) + ay*(cb[i][j+1][k].bz-cb[i][j][k].bz+cb[i][j-1][k].bz-cb[i][j-2][k].bz) )  -   dtdz*( bz*(cb[i][j][k].by-cb[i][j][k-1].by) + az*(cb[i][j][k+1].by-cb[i][j][k].by+cb[i][j][k-1].by-cb[i][j][k-2].by) )  -   cj[i][j][k].jx*dx;

                ce[i][j][k].ey = ce[i][j][k].ey   -   dtdx*( bx*(cb[i][j][k].bz-cb[i-1][j][k].bz) + ax*(cb[i+1][j][k].bz-cb[i][j][k].bz+cb[i-1][j][k].bz-cb[i-2][j][k].bz) )  +   dtdz*( bz*(cb[i][j][k].bx-cb[i][j][k-1].bx) + az*(cb[i][j][k+1].bx-cb[i][j][k].bx+cb[i][j][k-1].bx-cb[i][j][k-2].bx) )  -   cj[i][j][k].jy*dy;

                ce[i][j][k].ez = ce[i][j][k].ez   +   dtdx*( bx*(cb[i][j][k].by-cb[i-1][j][k].by) + ax*(cb[i+1][j][k].by-cb[i][j][k].by+cb[i-1][j][k].by-cb[i-2][j][k].by) )  -   dtdy*( by*(cb[i][j][k].bx-cb[i][j-1][k].bx) + ay*(cb[i][j+1][k].bx-cb[i][j][k].bx+cb[i][j-1][k].bx-cb[i][j-2][k].bx) )  -   cj[i][j][k].jz*dz;
            }
        }
    }
    {int i=1;
        for(int j=2;j<ny-2;j++) {
            for(int k=2;k<nz-2;k++) {
                ce[i][j][k].ex = ce[i][j][k].ex   +   dtdy*( by*(cb[i][j][k].bz-cb[i][j-1][k].bz) + ay*(cb[i][j+1][k].bz-cb[i][j][k].bz+cb[i][j-1][k].bz-cb[i][j-2][k].bz) )  -   dtdz*( bz*(cb[i][j][k].by-cb[i][j][k-1].by) + az*(cb[i][j][k+1].by-cb[i][j][k].by+cb[i][j][k-1].by-cb[i][j][k-2].by) )  -   cj[i][j][k].jx*dx;
            }
        }
    }
    for(int i=2;i<nx-2;i++) {
        {int j=1;
            for(int k=2;k<nz-2;k++) {
                ce[i][j][k].ey = ce[i][j][k].ey   -   dtdx*( bx*(cb[i][j][k].bz-cb[i-1][j][k].bz) + ax*(cb[i+1][j][k].bz-cb[i][j][k].bz+cb[i-1][j][k].bz-cb[i-2][j][k].bz) )  +   dtdz*( bz*(cb[i][j][k].bx-cb[i][j][k-1].bx) + az*(cb[i][j][k+1].bx-cb[i][j][k].bx+cb[i][j][k-1].bx-cb[i][j][k-2].bx) )  -   cj[i][j][k].jy*dy;
            }
        }
    }
    for(int i=2;i<nx-2;i++) {
        for(int j=2;j<ny-2;j++) {
            {int k=1;
                ce[i][j][k].ez = ce[i][j][k].ez   +   dtdx*( bx*(cb[i][j][k].by-cb[i-1][j][k].by) + ax*(cb[i+1][j][k].by-cb[i][j][k].by+cb[i-1][j][k].by-cb[i-2][j][k].by) )  -   dtdy*( by*(cb[i][j][k].bx-cb[i][j-1][k].bx) + ay*(cb[i][j+1][k].bx-cb[i][j][k].bx+cb[i][j-1][k].bx-cb[i][j-2][k].bx) )  -   cj[i][j][k].jz*dz;
            }
        }
    }
}